

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

pair<bool,_ccs::Value> * __thiscall
anon_unknown.dwarf_51181::P::parseAndReturnValue
          (pair<bool,_ccs::Value> *__return_storage_ptr__,P *this,string *input)

{
  AstRule *pAVar1;
  bool bVar2;
  long lVar3;
  allocator local_231;
  Nested ast;
  undefined1 local_200 [32];
  anon_union_8_3_b5ef88d7_for_rawPrimVal_ aStack_1e0;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  istringstream str;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)input,_S_in);
  ast.super_AstRule._vptr_AstRule = (_func_int **)&PTR__Nested_001974a8;
  ast.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ast.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ast.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ast.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ast.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_200,"<literal>",&local_231);
  bVar2 = ::ccs::Parser::parseCcsStream(&this->parser,(string *)local_200,(istream *)&str,&ast);
  std::__cxx11::string::~string((string *)local_200);
  if (((bVar2) &&
      ((long)ast.rules_.
             super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)ast.rules_.
             super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 8)) &&
     (pAVar1 = ((ast.rules_.
                 super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>.
               _M_t.
               super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
               super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl,
     pAVar1 != (AstRule *)0x0)) {
    lVar3 = __dynamic_cast(pAVar1,&::ccs::ast::AstRule::typeinfo,&::ccs::ast::PropDef::typeinfo);
    if (lVar3 != 0) {
      __return_storage_ptr__->first = true;
      ::ccs::Value::Value(&__return_storage_ptr__->second,(Value *)(lVar3 + 0x28));
      goto LAB_001276c9;
    }
  }
  local_1d8._M_p = (pointer)&local_1c8;
  local_200._0_4_ = String;
  local_200._8_8_ = (pointer)0x0;
  local_200._16_8_ = 0;
  local_200._24_8_ = 0;
  aStack_1e0.intVal = 0;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_1b8._M_p = (pointer)&local_1a8;
  local_1b0 = 0;
  local_1a8._M_local_buf[0] = '\0';
  __return_storage_ptr__->first = false;
  ::ccs::Value::Value(&__return_storage_ptr__->second,(Value *)local_200);
  ::ccs::Value::~Value((Value *)local_200);
LAB_001276c9:
  ::ccs::ast::Nested::~Nested(&ast);
  std::__cxx11::istringstream::~istringstream((istringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Value> parseAndReturnValue(const std::string &input) {
    std::istringstream str(input);
    ast::Nested ast;
    if (!parser.parseCcsStream("<literal>", str, ast)) return {false, Value()};
    if (ast.rules_.size() != 1) return {false, Value()};
    ast::PropDef *propDef = dynamic_cast<ast::PropDef*>(ast.rules_[0].get());
    if (!propDef) return {false, Value()};
    return {true, propDef->value_};
  }